

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> __thiscall
wabt::interp::TagType::Clone(TagType *this)

{
  TagType *this_local;
  
  this_local = this;
  std::make_unique<wabt::interp::TagType,wabt::interp::TagType_const&>
            ((TagType *)&stack0xffffffffffffffe0);
  std::unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>>::
  unique_ptr<wabt::interp::TagType,std::default_delete<wabt::interp::TagType>,void>
            ((unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>> *)
             this,(unique_ptr<wabt::interp::TagType,_std::default_delete<wabt::interp::TagType>_> *)
                  &stack0xffffffffffffffe0);
  std::unique_ptr<wabt::interp::TagType,_std::default_delete<wabt::interp::TagType>_>::~unique_ptr
            ((unique_ptr<wabt::interp::TagType,_std::default_delete<wabt::interp::TagType>_> *)
             &stack0xffffffffffffffe0);
  return (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ExternType> TagType::Clone() const {
  return std::make_unique<TagType>(*this);
}